

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reverse.h
# Opt level: O0

void Eigen::internal::vectorwise_reverse_inplace_impl<0>::run<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *xpr)

{
  Index IVar1;
  RowsBlockXpr local_f8;
  ColwiseReturnType local_c0;
  ReverseReturnType local_88;
  RowsBlockXpr local_50;
  Index local_18;
  Index half;
  Matrix<double,__1,__1,_0,__1,__1> *xpr_local;
  
  half = (Index)xpr;
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  local_18 = IVar1 / 2;
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::topRows
            (&local_50,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)half,local_18);
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRows
            (&local_f8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)half,local_18);
  DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::colwise
            (&local_c0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_f8);
  VectorwiseOp<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::reverse
            (&local_88,&local_c0);
  DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
  swap<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,0>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)&local_50,
             (DenseBase<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
              *)&local_88);
  return;
}

Assistant:

static void run(ExpressionType &xpr)
  {
    Index half = xpr.rows()/2;
    xpr.topRows(half).swap(xpr.bottomRows(half).colwise().reverse());
  }